

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int ParseServerInstruction(TidyDocImpl *doc)

{
  Lexer *lexer_00;
  bool bVar1;
  uint uVar2;
  Bool BVar3;
  int local_28;
  Bool isrule;
  int delim;
  uint c;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  local_28 = 0x22;
  bVar1 = false;
  uVar2 = prvTidyReadChar(doc->docIn);
  prvTidyAddCharToLexer(lexer_00,uVar2);
  if (((uVar2 == 0x25) || (uVar2 == 0x3f)) || (uVar2 == 0x40)) {
    bVar1 = true;
  }
  do {
    while( true ) {
      uVar2 = prvTidyReadChar(doc->docIn);
      if (uVar2 == 0xffffffff) {
        return local_28;
      }
      if (uVar2 == 0x3e) {
        if (bVar1) {
          prvTidyAddCharToLexer(lexer_00,0x3e);
          return local_28;
        }
        prvTidyUngetChar(0x3e,doc->docIn);
        return local_28;
      }
      if ((!bVar1) && (BVar3 = prvTidyIsWhite(uVar2), BVar3 != no)) {
        return local_28;
      }
      prvTidyAddCharToLexer(lexer_00,uVar2);
      if (uVar2 == 0x22) break;
      if (uVar2 == 0x27) {
        do {
          uVar2 = prvTidyReadChar(doc->docIn);
          if (uVar2 == 0xffffffff) {
            prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x283);
            prvTidyUngetChar(0xffffffff,doc->docIn);
            return 0;
          }
          if (uVar2 == 0x3e) {
            prvTidyUngetChar(0x3e,doc->docIn);
            prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x289);
            return 0;
          }
          prvTidyAddCharToLexer(lexer_00,uVar2);
        } while (uVar2 != 0x27);
      }
    }
    do {
      uVar2 = prvTidyReadChar(doc->docIn);
      if (uVar2 == 0xffffffff) {
        prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x283);
        prvTidyUngetChar(0xffffffff,doc->docIn);
        return 0;
      }
      if (uVar2 == 0x3e) {
        prvTidyUngetChar(0x3e,doc->docIn);
        prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x289);
        return 0;
      }
      prvTidyAddCharToLexer(lexer_00,uVar2);
    } while (uVar2 != 0x22);
    local_28 = 0x27;
  } while( true );
}

Assistant:

static int ParseServerInstruction( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    uint c;
    int delim = '"';
    Bool isrule = no;

    c = TY_(ReadChar)(doc->docIn);
    TY_(AddCharToLexer)(lexer, c);

    /* check for ASP, PHP or Tango */
    if (c == '%' || c == '?' || c == '@')
        isrule = yes;

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
            break;

        if (c == '>')
        {
            if (isrule)
                TY_(AddCharToLexer)(lexer, c);
            else
                TY_(UngetChar)(c, doc->docIn);

            break;
        }

        /* if not recognized as ASP, PHP or Tango */
        /* then also finish value on whitespace */
        if (!isrule)
        {
            if (TY_(IsWhite)(c))
                break;
        }

        TY_(AddCharToLexer)(lexer, c);

        if (c == '"')
        {
            do
            {
                c = TY_(ReadChar)(doc->docIn);
                if (c == EndOfStream) /* #427840 - fix by Terry Teague 30 Jun 01 */
                {
                    TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
                    TY_(UngetChar)(c, doc->docIn);
                    return 0;
                }
                if (c == '>') /* #427840 - fix by Terry Teague 30 Jun 01 */
                {
                    TY_(UngetChar)(c, doc->docIn);
                    TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
                    return 0;
                }
                TY_(AddCharToLexer)(lexer, c);
            }
            while (c != '"');
            delim = '\'';
            continue;
        }

        if (c == '\'')
        {
            do
            {
                c = TY_(ReadChar)(doc->docIn);
                if (c == EndOfStream) /* #427840 - fix by Terry Teague 30 Jun 01 */
                {
                    TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
                    TY_(UngetChar)(c, doc->docIn);
                    return 0;
                }
                if (c == '>') /* #427840 - fix by Terry Teague 30 Jun 01 */
                {
                    TY_(UngetChar)(c, doc->docIn);
                    TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
                    return 0;
                }
                TY_(AddCharToLexer)(lexer, c);
            }
            while (c != '\'');
        }
    }

    return delim;
}